

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O0

void __thiscall Neuron_testApplyInTime_Test::TestBody(Neuron_testApplyInTime_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  char *pcVar3;
  char *in_R9;
  float fVar4;
  string local_7a0;
  AssertHelper local_780;
  Message local_778;
  undefined1 local_770 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_740;
  Message local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_700;
  Message local_6f8;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_6c0;
  Message local_6b8;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_680;
  Message local_678;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_640;
  Message local_638;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_600;
  Message local_5f8;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_5c0;
  Message local_5b8;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_580;
  Message local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_540;
  Message local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_500;
  Message local_4f8;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_4c0;
  Message local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_;
  int iStack_494;
  bool fired;
  float mem;
  int t;
  Neuron n;
  ostream local_410 [8];
  ofstream fns;
  undefined1 local_210 [8];
  ofstream fn;
  Neuron_testApplyInTime_Test *this_local;
  
  std::ofstream::ofstream(local_210);
  std::ofstream::ofstream(local_410);
  std::ofstream::open(local_210,"testApply.csv",0x10);
  std::ofstream::open(local_410,"testApply.txt",0x10);
  Neuron::Neuron((Neuron *)&mem,10.0,1.0,50.0);
  for (iStack_494 = 0; iStack_494 < 1000; iStack_494 = iStack_494 + 1) {
    fVar4 = Neuron::mem((Neuron *)&mem);
    poVar2 = (ostream *)std::ostream::operator<<(local_210,iStack_494);
    poVar2 = std::operator<<(poVar2,"; ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar4);
    poVar2 = std::operator<<(poVar2,"; ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(local_410,">");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_494);
    poVar2 = std::operator<<(poVar2," U=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar4);
    poVar2 = std::operator<<(poVar2," I=");
    fVar4 = Neuron::syn((Neuron *)&mem);
    this_00 = (void *)std::ostream::operator<<(poVar2,fVar4);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    gtest_ar_.message_.ptr_._7_1_ = Neuron::tick((Neuron *)&mem,1.0);
    if ((bool)gtest_ar_.message_.ptr_._7_1_) {
      std::operator<<(local_410,"\t\t\t****** spike\n");
    }
    if (iStack_494 == 10) {
      Neuron::apply((Neuron *)&mem,50.0,(Connection *)0x0);
    }
    if (iStack_494 == 0x30) {
      fVar4 = Neuron::mem((Neuron *)&mem);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_4b0,0.0 < fVar4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
      if (!bVar1) {
        testing::Message::Message(&local_4b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__1.message_,(internal *)local_4b0,
                   (AssertionResult *)"n.mem() > 0","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_4c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x7a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_4c0,&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4c0);
        std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_4b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
    }
    if (iStack_494 == 0x31) {
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)local_4f0,(bool)(gtest_ar_.message_.ptr_._7_1_ & 1));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
      if (!bVar1) {
        testing::Message::Message(&local_4f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_4f0,(AssertionResult *)"fired",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_500,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x7d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
        testing::internal::AssertHelper::~AssertHelper(&local_500);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_4f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
    }
    if (iStack_494 == 100) {
      bVar1 = Neuron::apply((Neuron *)&mem,80.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_530,(bool)(~bVar1 & 1));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
      if (!bVar1) {
        testing::Message::Message(&local_538);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_530,
                   (AssertionResult *)"n.apply(80)","true","false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_540,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x80,pcVar3);
        testing::internal::AssertHelper::operator=(&local_540,&local_538);
        testing::internal::AssertHelper::~AssertHelper(&local_540);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_538);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
    }
    if (iStack_494 == 200) {
      bVar1 = Neuron::apply((Neuron *)&mem,50.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_570,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
      if (!bVar1) {
        testing::Message::Message(&local_578);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__4.message_,(internal *)local_570,
                   (AssertionResult *)"n.apply(50)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_580,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x83,pcVar3);
        testing::internal::AssertHelper::operator=(&local_580,&local_578);
        testing::internal::AssertHelper::~AssertHelper(&local_580);
        std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_578);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
    }
    if (iStack_494 == 0xe6) {
      bVar1 = Neuron::apply((Neuron *)&mem,-50.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_5b0,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
      if (!bVar1) {
        testing::Message::Message(&local_5b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__5.message_,(internal *)local_5b0,
                   (AssertionResult *)"n.apply(-50)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_5c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x86,pcVar3);
        testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
        testing::internal::AssertHelper::~AssertHelper(&local_5c0);
        std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
        testing::Message::~Message(&local_5b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
    }
    if (iStack_494 == 0x104) {
      bVar1 = Neuron::apply((Neuron *)&mem,-50.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_5f0,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
      if (!bVar1) {
        testing::Message::Message(&local_5f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__6.message_,(internal *)local_5f0,
                   (AssertionResult *)"n.apply(-50)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_600,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x89,pcVar3);
        testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
        testing::internal::AssertHelper::~AssertHelper(&local_600);
        std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
        testing::Message::~Message(&local_5f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
    }
    if (iStack_494 == 0x154) {
      bVar1 = Neuron::apply((Neuron *)&mem,10.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_630,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
      if (!bVar1) {
        testing::Message::Message(&local_638);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__7.message_,(internal *)local_630,
                   (AssertionResult *)"n.apply(10)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_640,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x8c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_640,&local_638);
        testing::internal::AssertHelper::~AssertHelper(&local_640);
        std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
        testing::Message::~Message(&local_638);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
    }
    if (iStack_494 == 400) {
      bVar1 = Neuron::apply((Neuron *)&mem,160.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_670,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
      if (!bVar1) {
        testing::Message::Message(&local_678);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8.message_,(internal *)local_670,
                   (AssertionResult *)"n.apply(160)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_680,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x8f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_680,&local_678);
        testing::internal::AssertHelper::~AssertHelper(&local_680);
        std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
        testing::Message::~Message(&local_678);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
    }
    if (iStack_494 == 0x1cc) {
      bVar1 = Neuron::apply((Neuron *)&mem,160.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_6b0,(bool)(~bVar1 & 1));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
      if (!bVar1) {
        testing::Message::Message(&local_6b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__9.message_,(internal *)local_6b0,
                   (AssertionResult *)"n.apply(160)","true","false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_6c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x92,pcVar3);
        testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
        testing::internal::AssertHelper::~AssertHelper(&local_6c0);
        std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
        testing::Message::~Message(&local_6b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
    }
    if ((0x31 < iStack_494) && (iStack_494 < 0x19e)) {
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)local_6f0,(bool)(~gtest_ar_.message_.ptr_._7_1_ & 1));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
      if (!bVar1) {
        testing::Message::Message(&local_6f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__10.message_,(internal *)local_6f0,(AssertionResult *)"fired"
                   ,"true","false",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_700,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x95,pcVar3);
        testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
        testing::internal::AssertHelper::~AssertHelper(&local_700);
        std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
        testing::Message::~Message(&local_6f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
    }
    if (iStack_494 == 0x244) {
      bVar1 = Neuron::apply((Neuron *)&mem,50.0,(Connection *)0x0);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_730,bVar1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
      if (!bVar1) {
        testing::Message::Message(&local_738);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__11.message_,(internal *)local_730,
                   (AssertionResult *)"n.apply(50)","false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_740,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x98,pcVar3);
        testing::internal::AssertHelper::operator=(&local_740,&local_738);
        testing::internal::AssertHelper::~AssertHelper(&local_740);
        std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
        testing::Message::~Message(&local_738);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
    }
    if (0x28a < iStack_494) {
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)local_770,(bool)(~gtest_ar_.message_.ptr_._7_1_ & 1));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
      if (!bVar1) {
        testing::Message::Message(&local_778);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_7a0,(internal *)local_770,(AssertionResult *)"fired","true","false",in_R9)
        ;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_780,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0x9b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_780,&local_778);
        testing::internal::AssertHelper::~AssertHelper(&local_780);
        std::__cxx11::string::~string((string *)&local_7a0);
        testing::Message::~Message(&local_778);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
    }
  }
  Neuron::~Neuron((Neuron *)&mem);
  std::ofstream::~ofstream(local_410);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

TEST(Neuron, testApplyInTime)
{
    std::ofstream fn, fns;
    fn.open("testApply.csv");
    fns.open("testApply.txt");

    Neuron n(10, 1, 50);

    for (int t = 0; t < 1000; ++t) {
        float mem = n.mem();
        fn << t << "; " << mem << "; " << std::endl;
        fns << ">" << t << " U=" << mem << " I="<< n.syn() << std::endl;

        bool fired = n.tick(TIME_STEP);
        if (fired)
            fns << "\t\t\t****** spike\n";

        if (t == 10)
            n.apply(50);

        if (t == 48)
            EXPECT_TRUE(n.mem() > 0);

        if (t == 49)
            EXPECT_TRUE(fired);

        if (t == 100)
            EXPECT_FALSE(n.apply(80));

        if (t == 200)
            EXPECT_TRUE(n.apply(50));

        if (t == 230)
            EXPECT_TRUE(n.apply(-50));

        if (t == 260)
            EXPECT_TRUE(n.apply(-50));

        if (t == 340)
            EXPECT_TRUE(n.apply(10));

        if (t == 400)
            EXPECT_TRUE(n.apply(160));

        if (t == 460)
            EXPECT_FALSE(n.apply(160));

        if (t >=50 && t < 414)
            EXPECT_FALSE(fired);

        if (t == 580)
            EXPECT_TRUE(n.apply(50));

        if (t > 650)
            EXPECT_FALSE(fired);
    }
}